

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tests.cpp
# Opt level: O1

void __thiscall
MatrixTests_ChainedOperations_Test::TestBody(MatrixTests_ChainedOperations_Test *this)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  AssertionResult gtest_ar_3;
  double sum4;
  matrix res4;
  matrix res3;
  matrix res2;
  double sum3;
  double sum2;
  double sum;
  matrix res1;
  matrix third;
  matrix second;
  matrix first;
  AssertHelper local_2e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  AssertHelper local_2d0;
  AssertHelper local_2c8;
  AssertHelper local_2c0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  undefined8 local_2b0;
  AssertHelperData *local_2a8 [9];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  undefined8 local_250;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_248 [9];
  double local_200;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  undefined8 local_1f0;
  double local_1e8 [10];
  double local_198;
  double local_190 [25];
  double local_c8 [12];
  double local_68 [12];
  
  local_68[0] = 4.44659081257122e-323;
  local_68[1] = 1.48219693752374e-323;
  local_68[2] = 1.48219693752374e-323;
  lVar2 = 0x18;
  do {
    *(undefined8 *)((long)local_68 + lVar2) = 0x3ff0000000000000;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x60);
  local_c8[0] = 4.44659081257122e-323;
  local_c8[1] = 1.48219693752374e-323;
  local_c8[2] = 1.48219693752374e-323;
  lVar2 = 0x18;
  do {
    *(undefined8 *)((long)local_c8 + lVar2) = 0x4000000000000000;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x60);
  local_190[0xd] = 4.44659081257122e-323;
  local_190[0xe] = 1.48219693752374e-323;
  local_190[0xf] = 1.48219693752374e-323;
  lVar2 = 0x18;
  do {
    *(undefined8 *)((long)local_190 + lVar2 + 0x68) = 0x4008000000000000;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x60);
  local_190[1] = 4.44659081257122e-323;
  local_190[2] = 1.48219693752374e-323;
  local_190[3] = 1.48219693752374e-323;
  local_190[4] = 0.0;
  local_190[5] = 0.0;
  local_190[6] = 0.0;
  local_190[7] = 0.0;
  local_190[8] = 0.0;
  local_190[9] = 0.0;
  local_190[10] = 0.0;
  local_190[0xb] = 0.0;
  local_190[0xc] = 0.0;
  lVar2 = 0;
  do {
    *(double *)((long)local_190 + lVar2 + 0x20) =
         *(double *)((long)local_68 + lVar2 + 0x18) + *(double *)((long)local_c8 + lVar2 + 0x18) +
         *(double *)((long)local_190 + lVar2 + 0x80);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x48);
  lVar2 = 0x18;
  local_190[0] = 0.0;
  do {
    local_190[0] = local_190[0] + *(double *)((long)local_190 + lVar2 + 8);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x60);
  local_260.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_404b000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_200,"sum","(1.0 + 2.0 + 3.0) * res1.size()",local_190,
             (double *)&local_260);
  if (local_200._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_260);
    if (local_1f8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1f8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/matrix_tests.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    if (local_260.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_260.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_260.ptr_ + 8))();
      }
      local_260.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_200 = 4.44659081257122e-323;
    lVar2 = 3;
    local_1f8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
    local_1f0 = 3;
    local_1e8[0] = 0.0;
    local_1e8[1] = 0.0;
    local_1e8[2] = 0.0;
    local_1e8[3] = 0.0;
    local_1e8[4] = 0.0;
    local_1e8[5] = 0.0;
    local_1e8[6] = 0.0;
    local_1e8[7] = 0.0;
    local_1e8[8] = 0.0;
    do {
      (&local_200)[lVar2] = local_68[lVar2] + local_c8[lVar2] + local_190[lVar2 + 0xd] + 6.0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xc);
    lVar2 = 0x18;
    local_198 = 0.0;
    do {
      local_198 = local_198 + *(double *)((long)&local_200 + lVar2);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x60);
    local_2c0.data_ = (AssertHelperData *)&DAT_405b000000000000;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_260,"sum2","(1.0 + 2.0 + 3.0 + 6.0) * res2.size()",&local_198,
               (double *)&local_2c0);
    if (local_260.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_2c0);
      if (local_258.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_258.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/matrix_tests.cpp"
                 ,0x5f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_2c0);
      testing::internal::AssertHelper::~AssertHelper(&local_2e8);
      if (local_2c0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_2c0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_2c0.data_ + 8))();
        }
        local_2c0.data_ = (AssertHelperData *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_258,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_258,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_260.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9;
      lVar2 = 3;
      local_258.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
      local_250 = 3;
      local_248[0] = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_248[1] = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_248[2] = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_248[3] = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_248[4] = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_248[5] = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_248[6] = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_248[7] = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_248[8] = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      do {
        (&local_260)[lVar2].ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_68[lVar2] + 10.0 + local_c8[lVar2] + local_190[lVar2 + 0xd]);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0xc);
      lVar2 = 0x18;
      local_1e8[9] = 0.0;
      do {
        local_1e8[9] = local_1e8[9] + *(double *)((long)&local_260.ptr_ + lVar2);
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x60);
      local_2e8.data_ = (AssertHelperData *)&DAT_4062000000000000;
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_2c0,"sum3","(1.0 + 10.0 + 2.0 + 3.0) * res3.size()",
                 local_1e8 + 9,(double *)&local_2e8);
      if (local_2c0.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_2e8);
        if (local_2b8.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_2b8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/matrix_tests.cpp"
                   ,99,pcVar3);
        testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2e8);
        testing::internal::AssertHelper::~AssertHelper(&local_2d0);
        if (local_2e8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_2e8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_2e8.data_ + 8))();
          }
          local_2e8.data_ = (AssertHelperData *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_2b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        local_2c0.data_ = (AssertHelperData *)0x9;
        lVar2 = 3;
        local_2b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
        local_2b0 = 3;
        local_2a8[0] = (AssertHelperData *)0x0;
        local_2a8[1] = (AssertHelperData *)0x0;
        local_2a8[2] = (AssertHelperData *)0x0;
        local_2a8[3] = (AssertHelperData *)0x0;
        local_2a8[4] = (AssertHelperData *)0x0;
        local_2a8[5] = (AssertHelperData *)0x0;
        local_2a8[6] = (AssertHelperData *)0x0;
        local_2a8[7] = (AssertHelperData *)0x0;
        local_2a8[8] = (AssertHelperData *)0x0;
        do {
          (&local_2c0)[lVar2].data_ =
               (AssertHelperData *)((local_68[lVar2] + local_c8[lVar2]) - local_190[lVar2 + 0xd]);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0xc);
        lVar2 = 0x18;
        local_2d0.data_ = (AssertHelperData *)0x0;
        do {
          local_2d0.data_ =
               (AssertHelperData *)(local_2d0.data_ + *(double *)((long)&local_2c0.data_ + lVar2));
          lVar2 = lVar2 + 8;
        } while (lVar2 != 0x60);
        local_2d8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&local_2e8,"sum4","0.0",(double *)&local_2d0,(double *)&local_2d8);
        if (local_2e8.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_2d8);
          if (local_2e0.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_2e0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/matrix_tests.cpp"
                     ,0x67,pcVar3);
          testing::internal::AssertHelper::operator=(&local_2c8,(Message *)&local_2d8);
          testing::internal::AssertHelper::~AssertHelper(&local_2c8);
          if (local_2d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_2d8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_2d8.ptr_ + 8))();
            }
            local_2d8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
    }
  }
  return;
}

Assistant:

TEST(MatrixTests, ChainedOperations)
{
	using matrix = mcc::matrix<double, 3, 3>;
	matrix first(1.0);
	matrix second(2.0);
	matrix third(3.0);

	matrix res1 = first + second + third;
	const auto sum = std::accumulate(res1.begin(), res1.end(), 0.0);
	ASSERT_EQ(sum, (1.0 + 2.0 + 3.0) * res1.size());

	matrix res2 = first + second + third + 6.0;
	const auto sum2 = std::accumulate(res2.begin(), res2.end(), 0.0);
	ASSERT_EQ(sum2, (1.0 + 2.0 + 3.0 + 6.0) * res2.size());

	matrix res3 = first + 10.0 + second + third;
	const auto sum3 = std::accumulate(res3.begin(), res3.end(), 0.0);
	ASSERT_EQ(sum3, (1.0 + 10.0 + 2.0 + 3.0) * res3.size());

	matrix res4 = (first + second) - third;
	const auto sum4 = std::accumulate(res4.begin(), res4.end(), 0.0);
	ASSERT_EQ(sum4, 0.0);
}